

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_quaternion rf_quaternion_slerp(rf_quaternion q1,rf_quaternion q2,float amount)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  rf_quaternion rVar13;
  
  fVar8 = q2.z;
  fVar9 = q2.w;
  fVar6 = q2.x;
  fVar7 = q2.y;
  fVar4 = q1.z;
  fVar5 = q1.w;
  fVar10 = q1.x;
  fVar11 = q1.y;
  fVar12 = fVar5 * fVar9 + fVar4 * fVar8 + fVar10 * fVar6 + fVar11 * fVar7;
  if (ABS((double)fVar12) < 1.0) {
    if (fVar12 <= 0.95) {
      dVar1 = acos((double)fVar12);
      fVar12 = 1.0 - fVar12 * fVar12;
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        fVar12 = SQRT(fVar12);
      }
      if (0.001 <= ABS(fVar12)) {
        fVar2 = sinf((1.0 - amount) * (float)dVar1);
        fVar2 = fVar2 / fVar12;
        fVar3 = sinf((float)dVar1 * amount);
        fVar3 = fVar3 / fVar12;
        fVar10 = fVar10 * fVar2 + fVar6 * fVar3;
        fVar11 = fVar11 * fVar2 + fVar7 * fVar3;
        fVar4 = fVar4 * fVar2 + fVar3 * fVar8;
        fVar5 = fVar5 * fVar2 + fVar3 * fVar9;
      }
      else {
        fVar10 = fVar10 * 0.5 + fVar6 * 0.5;
        fVar11 = fVar11 * 0.5 + fVar7 * 0.5;
        fVar4 = fVar4 * 0.5 + fVar8 * 0.5;
        fVar5 = fVar5 * 0.5 + fVar9 * 0.5;
      }
    }
    else {
      rVar13 = rf_quaternion_nlerp(q1,q2,amount);
      fVar4 = rVar13.z;
      fVar5 = rVar13.w;
      fVar10 = rVar13.x;
      fVar11 = rVar13.y;
    }
  }
  rVar13.y = fVar11;
  rVar13.x = fVar10;
  rVar13.w = fVar5;
  rVar13.z = fVar4;
  return rVar13;
}

Assistant:

RF_API rf_quaternion rf_quaternion_slerp(rf_quaternion q1, rf_quaternion q2, float amount)
{
    rf_quaternion result = {0};

    float cosHalfTheta = q1.x * q2.x + q1.y * q2.y + q1.z * q2.z + q1.w * q2.w;

    if (fabs(cosHalfTheta) >= 1.0f) result = q1;
    else if (cosHalfTheta > 0.95f) result = rf_quaternion_nlerp(q1, q2, amount);
    else
    {
        float halfTheta = (float) acos(cosHalfTheta);
        float sinHalfTheta = (float) sqrt(1.0f - cosHalfTheta * cosHalfTheta);

        if (fabs(sinHalfTheta) < 0.001f)
        {
            result.x = (q1.x * 0.5f + q2.x * 0.5f);
            result.y = (q1.y * 0.5f + q2.y * 0.5f);
            result.z = (q1.z * 0.5f + q2.z * 0.5f);
            result.w = (q1.w * 0.5f + q2.w * 0.5f);
        } else
        {
            float ratioA = sinf((1 - amount) * halfTheta) / sinHalfTheta;
            float ratioB = sinf(amount * halfTheta) / sinHalfTheta;

            result.x = (q1.x * ratioA + q2.x * ratioB);
            result.y = (q1.y * ratioA + q2.y * ratioB);
            result.z = (q1.z * ratioA + q2.z * ratioB);
            result.w = (q1.w * ratioA + q2.w * ratioB);
        }
    }

    return result;
}